

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

void printVectors(int argc,char **argv)

{
  FastText fasttext;
  allocator local_89;
  string local_88;
  undefined1 local_68 [32];
  __shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  __shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  if (argc == 3) {
    _Stack_48 = (__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)(ZEXT816(0) << 0x40);
    _Stack_28._M_ptr = (element_type *)0x0;
    _Stack_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_38._M_ptr = (element_type *)0x0;
    local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_68 = ZEXT1632((undefined1  [16])_Stack_48);
    std::__cxx11::string::string((string *)&local_88,argv[2],&local_89);
    ::fasttext::FastText::loadModel((FastText *)local_68,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    ::fasttext::FastText::printVectors((FastText *)local_68);
    exit(0);
  }
  printPrintVectorsUsage();
  exit(1);
}

Assistant:

void printVectors(int argc, char** argv) {
  if (argc != 3) {
    printPrintVectorsUsage();
    exit(EXIT_FAILURE);
  }
  FastText fasttext;
  fasttext.loadModel(std::string(argv[2]));
  fasttext.printVectors();
  exit(0);
}